

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

mallinfo * mspace_mallinfo(mallinfo *__return_storage_ptr__,mspace msp)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  __return_storage_ptr__->smblks = 0;
  __return_storage_ptr__->hblks = 0;
  __return_storage_ptr__->hblkhd = 0;
  __return_storage_ptr__->usmblks = 0;
  __return_storage_ptr__->fsmblks = 0;
  __return_storage_ptr__->uordblks = 0;
  __return_storage_ptr__->fordblks = 0;
  __return_storage_ptr__->keepcost = 0;
  __return_storage_ptr__->arena = 0;
  __return_storage_ptr__->ordblks = 0;
  __return_storage_ptr__->smblks = 0;
  __return_storage_ptr__->hblks = 0;
  __return_storage_ptr__->hblkhd = 0;
  __return_storage_ptr__->usmblks = 0;
  __return_storage_ptr__->fsmblks = 0;
  __return_storage_ptr__->uordblks = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (*(ulong *)((long)msp + 0x28) != 0) {
    sVar1 = *(size_t *)((long)msp + 0x10);
    sVar4 = sVar1 + 0x50;
    puVar7 = (ulong *)((long)msp + 0x378);
    sVar6 = 1;
    sVar5 = sVar4;
    do {
      uVar2 = *puVar7;
      uVar8 = (int)uVar2 + 0x10;
      uVar9 = (ulong)(-uVar8 & 0xf);
      if ((uVar8 & 0xf) == 0) {
        uVar9 = 0;
      }
      uVar9 = uVar9 + uVar2;
      do {
        if (((uVar9 == *(ulong *)((long)msp + 0x28)) || (puVar7[1] + uVar2 <= uVar9)) ||
           (uVar11 = *(ulong *)(uVar9 + 8), uVar11 == 0xb)) break;
        uVar10 = uVar11 & 0xfffffffffffffff8;
        sVar4 = sVar4 + uVar10;
        uVar8 = (uint)uVar11 & 3;
        uVar11 = 0;
        if (uVar8 == 1) {
          uVar11 = uVar10;
        }
        sVar5 = sVar5 + uVar11;
        sVar6 = sVar6 + (uVar8 == 1);
        uVar9 = uVar9 + uVar10;
      } while (uVar2 <= uVar9);
      puVar7 = (ulong *)puVar7[2];
    } while (puVar7 != (ulong *)0x0);
    __return_storage_ptr__->arena = sVar4;
    __return_storage_ptr__->ordblks = sVar6;
    lVar3 = *(long *)((long)msp + 0x358);
    __return_storage_ptr__->hblkhd = lVar3 - sVar4;
    __return_storage_ptr__->usmblks = *(size_t *)((long)msp + 0x360);
    __return_storage_ptr__->uordblks = lVar3 - sVar5;
    __return_storage_ptr__->fordblks = sVar5;
    __return_storage_ptr__->keepcost = sVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

struct mallinfo mspace_mallinfo(mspace msp) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return internal_mallinfo(ms);
}